

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFHighLevelEncoder.cpp
# Opt level: O1

void ZXing::Pdf417::EncodeBinary
               (string *bytes,int startpos,int count,int startmode,
               vector<int,_std::allocator<int>_> *output)

{
  uint uVar1;
  undefined4 in_register_0000000c;
  vector<int,std::allocator<int>> *this;
  ulong uVar2;
  int *__args;
  long lVar3;
  iterator iVar4;
  ulong uVar5;
  int chars [5];
  uint local_48 [6];
  
  this = (vector<int,std::allocator<int>> *)CONCAT44(in_register_0000000c,startmode);
  if (startpos == 1 && count == 0) {
    iVar4._M_current = *(int **)(this + 8);
    if (iVar4._M_current == *(int **)(this + 0x10)) {
      __args = &SHIFT_TO_BYTE;
      goto LAB_0017e016;
    }
    *iVar4._M_current = 0x391;
  }
  else {
    uVar1 = startpos * -0x55555555 + 0x2aaaaaaa;
    iVar4._M_current = *(int **)(this + 8);
    if ((uVar1 >> 1 | (uint)((uVar1 & 1) != 0) << 0x1f) < 0x2aaaaaab) {
      if (iVar4._M_current == *(int **)(this + 0x10)) {
        __args = &LATCH_TO_BYTE;
        goto LAB_0017e016;
      }
      *iVar4._M_current = 0x39c;
    }
    else {
      if (iVar4._M_current == *(int **)(this + 0x10)) {
        __args = &LATCH_TO_BYTE_PADDED;
LAB_0017e016:
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>(this,iVar4,__args);
        goto LAB_0017e01e;
      }
      *iVar4._M_current = 0x385;
    }
  }
  *(int **)(this + 8) = iVar4._M_current + 1;
LAB_0017e01e:
  uVar5 = 0;
  if (5 < startpos) {
    uVar5 = 0;
    do {
      lVar3 = -6;
      uVar2 = 0;
      do {
        uVar2 = (ulong)(byte)(bytes->_M_dataplus)._M_p[lVar3 + uVar5 + 6] | uVar2 << 8;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0);
      lVar3 = 0;
      do {
        local_48[lVar3] = (int)uVar2 + (int)((long)uVar2 / 900) * -900;
        lVar3 = lVar3 + 1;
        uVar2 = (long)uVar2 / 900;
      } while (lVar3 != 5);
      lVar3 = 0x10;
      do {
        iVar4._M_current = *(int **)(this + 8);
        if (iVar4._M_current == *(int **)(this + 0x10)) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    (this,iVar4,(int *)((long)local_48 + lVar3));
        }
        else {
          *iVar4._M_current = *(int *)((long)local_48 + lVar3);
          *(int **)(this + 8) = iVar4._M_current + 1;
        }
        lVar3 = lVar3 + -4;
      } while (lVar3 != -4);
      uVar5 = uVar5 + 6;
    } while (5 < startpos - (int)uVar5);
  }
  if ((int)uVar5 < startpos) {
    uVar5 = uVar5 & 0xffffffff;
    do {
      local_48[0] = (uint)(byte)(bytes->_M_dataplus)._M_p[uVar5];
      iVar4._M_current = *(int **)(this + 8);
      if (iVar4._M_current == *(int **)(this + 0x10)) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  (this,iVar4,(int *)local_48);
      }
      else {
        *iVar4._M_current = local_48[0];
        *(int **)(this + 8) = iVar4._M_current + 1;
      }
      uVar5 = uVar5 + 1;
    } while ((int)uVar5 < startpos);
  }
  return;
}

Assistant:

static void EncodeBinary(const std::string& bytes, int startpos, int count, int startmode, std::vector<int>& output)
{
	if (count == 1 && startmode == TEXT_COMPACTION) {
		output.push_back(SHIFT_TO_BYTE);
	}
	else {
		if ((count % 6) == 0) {
			output.push_back(LATCH_TO_BYTE);
		}
		else {
			output.push_back(LATCH_TO_BYTE_PADDED);
		}
	}

	int idx = startpos;
	// Encode sixpacks
	if (count >= 6) {
		int chars[5];
		while ((startpos + count - idx) >= 6) {
			long t = 0;
			for (int i = 0; i < 6; i++) {
				t <<= 8;
				t += bytes[idx + i] & 0xff;
			}
			for (int i = 0; i < 5; i++) {
				chars[i] = t % 900;
				t /= 900;
			}
			for (int i = 4; i >= 0; i--) {
				output.push_back(chars[i]);
			}
			idx += 6;
		}
	}
	//Encode rest (remaining n<5 bytes if any)
	for (int i = idx; i < startpos + count; i++) {
		int ch = bytes[i] & 0xff;
		output.push_back(ch);
	}
}